

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O2

void wipe_Cleanup(void)

{
  if (wipe_scr_start != (short *)0x0) {
    operator_delete__(wipe_scr_start);
    wipe_scr_start = (short *)0x0;
  }
  if (wipe_scr_end != (short *)0x0) {
    operator_delete__(wipe_scr_end);
    wipe_scr_end = (short *)0x0;
  }
  if (0 < CurrentWipeType) {
    (*wipes[CurrentWipeType * 3 - 1])(0);
    return;
  }
  return;
}

Assistant:

void wipe_Cleanup()
{
	if (wipe_scr_start != NULL)
	{
		delete[] wipe_scr_start;
		wipe_scr_start = NULL;
	}
	if (wipe_scr_end != NULL)
	{
		delete[] wipe_scr_end;
		wipe_scr_end = NULL;
	}
	if (CurrentWipeType > 0)
	{
		(*wipes[(CurrentWipeType-1)*3+2])(0);
	}
}